

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_create_leaf(lys_node *schema,char *val_str,int dflt)

{
  int iVar1;
  lyd_node *node;
  hash_table *phVar2;
  char *value;
  
  node = (lyd_node *)calloc(1,0x50);
  if (node == (lyd_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_create_leaf"
          );
  }
  else {
    node->schema = schema;
    iVar1 = ly_new_node_validity(schema);
    node->validity = (uint8_t)iVar1;
    iVar1 = resolve_applies_when(schema,0,(lys_node *)0x0);
    if (iVar1 != 0) {
      node->field_0x9 = 8;
    }
    node->prev = node;
    *(undefined4 *)&node[1].schema = *(undefined4 *)&schema[1].ref;
    value = "";
    if (val_str != (char *)0x0) {
      value = val_str;
    }
    phVar2 = (hash_table *)lydict_insert(schema->module->ctx,value,0);
    node->ht = phVar2;
    node->field_0x9 = node->field_0x9 & 0xfe | (byte)dflt & 1;
    lyd_hash(node);
  }
  return node;
}

Assistant:

static struct lyd_node *
lyd_create_leaf(const struct lys_node *schema, const char *val_str, int dflt)
{
    struct lyd_node_leaf_list *ret;

    ret = calloc(1, sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(schema->module->ctx), NULL);

    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;
    ret->value_type = ((struct lys_node_leaf *)schema)->type.base;
    ret->value_str = lydict_insert(schema->module->ctx, val_str ? val_str : "", 0);
    ret->dflt = dflt;

#ifdef LY_ENABLED_CACHE
    lyd_hash((struct lyd_node *)ret);
#endif

    return (struct lyd_node *)ret;
}